

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BBlock.h
# Opt level: O3

void __thiscall dg::BBlock<dg::LLVMNode>::isolate(BBlock<dg::LLVMNode> *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  SuccContainerT *this_00;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr p_Var4;
  BBlock<dg::LLVMNode> *pBVar5;
  _Rb_tree_node_base *p_Var6;
  BBlockContainerT *pBVar7;
  _Self __tmp;
  _Base_ptr p_Var8;
  pair<std::_Rb_tree_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::_Rb_tree_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge>_>
  pVar9;
  pair<std::_Rb_tree_iterator<dg::BBlock<dg::LLVMNode>_*>,_std::_Rb_tree_iterator<dg::BBlock<dg::LLVMNode>_*>_>
  pVar10;
  DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> new_edges;
  _Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,_dg::BBlock<dg::LLVMNode>::BBlockEdge,_std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>_>
  local_98;
  BBlockEdge local_68;
  PredContainerT *local_58;
  _Base_ptr local_50;
  SuccContainerT *local_48;
  _Rb_tree_node_base *local_40;
  BBlock<dg::LLVMNode> *local_38;
  
  local_58 = &this->prevBBs;
  p_Var4 = *(_Base_ptr *)
            ((long)&(this->prevBBs).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t
                    ._M_impl.super__Rb_tree_header._M_header + 0x10);
  p_Var1 = &(this->prevBBs).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t._M_impl
            .super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    p_Var2 = &(this->nextBBs).container._M_t._M_impl.super__Rb_tree_header;
    do {
      pBVar5 = *(BBlock<dg::LLVMNode> **)(p_Var4 + 1);
      local_98._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_98._M_impl.super__Rb_tree_header._M_header;
      local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Var8 = (pBVar5->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var6 = &(pBVar5->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header;
      local_98._M_impl.super__Rb_tree_header._M_header._M_right =
           local_98._M_impl.super__Rb_tree_header._M_header._M_left;
      local_50 = p_Var4;
      if (p_Var8 != p_Var6) {
        local_48 = &pBVar5->nextBBs;
        local_40 = p_Var6;
        local_38 = pBVar5;
        do {
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
          pBVar5 = *(BBlock<dg::LLVMNode> **)(p_Var8 + 1);
          if (pBVar5 == this) {
            p_Var4 = (this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            if ((_Rb_tree_header *)p_Var4 != p_Var2) {
              do {
                if (*(BBlock<dg::LLVMNode> **)(p_Var4 + 1) != this) {
                  local_68.label = *(BBlockLabelTy *)&p_Var8[1]._M_parent;
                  local_68.target = *(BBlock<dg::LLVMNode> **)(p_Var4 + 1);
                  std::
                  _Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,dg::BBlock<dg::LLVMNode>::BBlockEdge,std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>>
                  ::_M_insert_unique<dg::BBlock<dg::LLVMNode>::BBlockEdge_const&>
                            ((_Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,dg::BBlock<dg::LLVMNode>::BBlockEdge,std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>>
                              *)&local_98,&local_68);
                }
                p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
              } while ((_Rb_tree_header *)p_Var4 != p_Var2);
              pBVar5 = *(BBlock<dg::LLVMNode> **)(p_Var8 + 1);
            }
            this_00 = local_48;
            local_68.label = *(BBlockLabelTy *)&p_Var8[1]._M_parent;
            local_68.target = pBVar5;
            pVar9 = std::
                    _Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,_dg::BBlock<dg::LLVMNode>::BBlockEdge,_std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>_>
                    ::equal_range((_Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,_dg::BBlock<dg::LLVMNode>::BBlockEdge,_std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>_>
                                   *)local_48,&local_68);
            std::
            _Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,_dg::BBlock<dg::LLVMNode>::BBlockEdge,_std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>_>
            ::_M_erase_aux((_Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,_dg::BBlock<dg::LLVMNode>::BBlockEdge,_std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>_>
                            *)this_00,(_Base_ptr)pVar9.first._M_node,(_Base_ptr)pVar9.second._M_node
                          );
            p_Var6 = local_40;
          }
          p_Var8 = p_Var3;
        } while (p_Var3 != p_Var6);
        for (p_Var6 = local_98._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var6 != &local_98._M_impl.super__Rb_tree_header;
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
          addSuccessor(local_38,(BBlockEdge *)(p_Var6 + 1));
        }
      }
      std::
      _Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,_dg::BBlock<dg::LLVMNode>::BBlockEdge,_std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>_>
      ::_M_erase(&local_98,(_Link_type)local_98._M_impl.super__Rb_tree_header._M_header._M_parent);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(local_50);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  removeSuccessors(this);
  std::
  _Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
  ::_M_erase((_Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
              *)local_58,
             *(_Link_type *)
              ((long)&(this->prevBBs).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container.
                      _M_t._M_impl.super__Rb_tree_header._M_header + 8));
  *(_Base_ptr *)
   ((long)&(this->prevBBs).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->prevBBs).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->prevBBs).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->prevBBs).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  p_Var4 = *(_Base_ptr *)
            ((long)&(this->controlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container.
                    _M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  p_Var1 = &(this->controlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
            _M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    do {
      if (*(BBlock<dg::LLVMNode> **)(p_Var4 + 1) != this) {
        pBVar7 = &(*(BBlock<dg::LLVMNode> **)(p_Var4 + 1))->revControlDeps;
        local_98._M_impl._0_8_ = this;
        pVar10 = std::
                 _Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                 ::equal_range((_Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                                *)pBVar7,(key_type *)&local_98);
        std::
        _Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
        ::_M_erase_aux((_Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                        *)pBVar7,(_Base_ptr)pVar10.first._M_node,(_Base_ptr)pVar10.second._M_node);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  p_Var4 = *(_Base_ptr *)
            ((long)&(this->revControlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.
                    container._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  p_Var2 = &(this->revControlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
            _M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var2) {
    do {
      if (*(BBlock<dg::LLVMNode> **)(p_Var4 + 1) != this) {
        pBVar7 = &(*(BBlock<dg::LLVMNode> **)(p_Var4 + 1))->controlDeps;
        local_98._M_impl._0_8_ = this;
        pVar10 = std::
                 _Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                 ::equal_range((_Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                                *)pBVar7,(key_type *)&local_98);
        std::
        _Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
        ::_M_erase_aux((_Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                        *)pBVar7,(_Base_ptr)pVar10.first._M_node,(_Base_ptr)pVar10.second._M_node);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var2);
  }
  std::
  _Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
  ::_M_erase((_Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
              *)&this->revControlDeps,
             *(_Link_type *)
              ((long)&(this->revControlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.
                      container._M_t._M_impl.super__Rb_tree_header._M_header + 8));
  *(_Base_ptr *)
   ((long)&(this->revControlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
           _M_impl.super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->revControlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
           _M_impl.super__Rb_tree_header._M_header + 0x10) = p_Var2;
  *(_Rb_tree_header **)
   ((long)&(this->revControlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
           _M_impl.super__Rb_tree_header._M_header + 0x18) = p_Var2;
  (this->revControlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  std::
  _Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
  ::_M_erase((_Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
              *)&this->controlDeps,
             *(_Link_type *)
              ((long)&(this->controlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.
                      container._M_t._M_impl.super__Rb_tree_header._M_header + 8));
  *(_Base_ptr *)
   ((long)&(this->controlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
           _M_impl.super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->controlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
           _M_impl.super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->controlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
           _M_impl.super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->controlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

void isolate() {
        // take every predecessor and reconnect edges from it
        // to successors
        for (BBlock<NodeT> *pred : prevBBs) {
            // find the edge that is going to this node
            // and create new edges to all successors. The new edges
            // will have the same label as the found one
            DGContainer<BBlockEdge> new_edges;
            for (auto I = pred->nextBBs.begin(), E = pred->nextBBs.end();
                 I != E;) {
                auto cur = I++;
                if (cur->target == this) {
                    // create edges that will go from the predecessor
                    // to every successor of this node
                    for (const BBlockEdge &succ : nextBBs) {
                        // we cannot create an edge to this bblock (we're
                        // isolating _this_ bblock), that would be incorrect. It
                        // can occur when we're isolatin a bblock with self-loop
                        if (succ.target != this)
                            new_edges.insert(
                                    BBlockEdge(succ.target, cur->label));
                    }

                    // remove the edge from predecessor
                    pred->nextBBs.erase(*cur);
                }
            }

            // add newly created edges to predecessor
            for (const BBlockEdge &edge : new_edges) {
                assert(edge.target != this &&
                       "Adding an edge to a block that is being isolated");
                pred->addSuccessor(edge);
            }
        }

        removeSuccessors();

        // NOTE: nextBBs were cleared in removeSuccessors()
        prevBBs.clear();

        // remove reverse edges to this BB
        for (BBlock<NodeT> *B : controlDeps) {
            // we don't want to corrupt the iterator
            // if this block is control dependent on itself.
            // We're gonna clear it anyway
            if (B == this)
                continue;

            B->revControlDeps.erase(this);
        }

        // clear also cd edges that blocks have
        // to this block
        for (BBlock<NodeT> *B : revControlDeps) {
            if (B == this)
                continue;

            B->controlDeps.erase(this);
        }

        revControlDeps.clear();
        controlDeps.clear();
    }